

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

int32_t lj_str_cmp(GCstr *a,GCstr *b)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint in_R9D;
  uint uVar8;
  uint uVar9;
  
  uVar1 = a->len;
  uVar2 = b->len;
  uVar5 = uVar2;
  if (uVar1 < uVar2) {
    uVar5 = uVar1;
  }
  if (uVar5 != 0) {
    uVar7 = 0;
    do {
      iVar6 = (int)uVar7;
      uVar8 = *(uint *)((long)&a[1].nextgc.gcptr32 + uVar7);
      uVar9 = *(uint *)((long)&b[1].nextgc.gcptr32 + uVar7);
      if (uVar8 == uVar9) {
        iVar4 = 0;
      }
      else {
        uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        iVar6 = iVar6 - uVar5;
        if (-4 < iVar6) {
          bVar3 = (char)iVar6 * '\b';
          uVar8 = uVar8 >> (bVar3 & 0x1f);
          uVar9 = uVar9 >> (bVar3 & 0x1f);
          iVar4 = 2;
          if (uVar8 == uVar9) goto LAB_0010d218;
        }
        in_R9D = -(uint)(uVar8 < uVar9) | 1;
        iVar4 = 1;
      }
LAB_0010d218:
      if (iVar4 != 0) {
        if (iVar4 == 2) {
          return uVar1 - uVar2;
        }
        return in_R9D;
      }
      uVar7 = (ulong)(iVar6 + 4U);
    } while (iVar6 + 4U < uVar5);
  }
  return uVar1 - uVar2;
}

Assistant:

int32_t LJ_FASTCALL lj_str_cmp(GCstr *a, GCstr *b)
{
  MSize i, n = a->len > b->len ? b->len : a->len;
  for (i = 0; i < n; i += 4) {
    /* Note: innocuous access up to end of string + 3. */
    uint32_t va = *(const uint32_t *)(strdata(a)+i);
    uint32_t vb = *(const uint32_t *)(strdata(b)+i);
    if (va != vb) {
#if LJ_LE
      va = lj_bswap(va); vb = lj_bswap(vb);
#endif
      i -= n;
      if ((int32_t)i >= -3) {
	va >>= 32+(i<<3); vb >>= 32+(i<<3);
	if (va == vb) break;
      }
      return va < vb ? -1 : 1;
    }
  }
  return (int32_t)(a->len - b->len);
}